

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::UnaryExpr<_duckdb_value_*const_&>::streamReconstructedExpression
          (UnaryExpr<_duckdb_value_*const_&> *this,ostream *os)

{
  ostream *in_RSI;
  _duckdb_value **in_stack_ffffffffffffffa8;
  string local_30 [48];
  
  Detail::stringify<_duckdb_value*>(in_stack_ffffffffffffffa8);
  std::operator<<(in_RSI,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }